

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

bool __thiscall GrcSymbolTableEntry::DoesJustification(GrcSymbolTableEntry *this)

{
  bool bVar1;
  
  do {
    bVar1 = std::operator==(&this->m_staFieldName,"justify");
    if (bVar1) {
      return bVar1;
    }
    this = this->m_psymtbl->m_psymParent;
  } while (this != (Symbol)0x0);
  return bVar1;
}

Assistant:

bool GrcSymbolTableEntry::DoesJustification()
{
	if (m_staFieldName == "justify")
		return true;
	Symbol psymParent = ParentSymbol();
	if (!psymParent)
		return false;
	return (psymParent->DoesJustification());
}